

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall TApp_ShortOpts_Test::TApp_ShortOpts_Test(TApp_ShortOpts_Test *this)

{
  TApp_ShortOpts_Test *this_local;
  
  TApp::TApp(&this->super_TApp);
  (this->super_TApp).super_Test._vptr_Test = (_func_int **)&PTR__TApp_ShortOpts_Test_00216020;
  return;
}

Assistant:

TEST_F(TApp, ShortOpts) {

    unsigned long long funnyint;
    std::string someopt;
    app.add_flag("-z", funnyint);
    app.add_option("-y", someopt);

    args = {
        "-zzyzyz",
    };

    run();

    EXPECT_EQ((size_t)2, app.count("-z"));
    EXPECT_EQ((size_t)1, app.count("-y"));
    EXPECT_EQ((unsigned long long)2, funnyint);
    EXPECT_EQ("zyz", someopt);
}